

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::copyFieldsFrom(DecimalQuantity *this,DecimalQuantity *other)

{
  DecimalQuantity *other_local;
  DecimalQuantity *this_local;
  
  this->bogus = (bool)(other->bogus & 1);
  this->lOptPos = other->lOptPos;
  this->lReqPos = other->lReqPos;
  this->rReqPos = other->rReqPos;
  this->rOptPos = other->rOptPos;
  this->scale = other->scale;
  this->precision = other->precision;
  this->flags = other->flags;
  this->origDouble = other->origDouble;
  this->origDelta = other->origDelta;
  this->isApproximate = other->isApproximate;
  return;
}

Assistant:

void DecimalQuantity::copyFieldsFrom(const DecimalQuantity& other) {
    bogus = other.bogus;
    lOptPos = other.lOptPos;
    lReqPos = other.lReqPos;
    rReqPos = other.rReqPos;
    rOptPos = other.rOptPos;
    scale = other.scale;
    precision = other.precision;
    flags = other.flags;
    origDouble = other.origDouble;
    origDelta = other.origDelta;
    isApproximate = other.isApproximate;
}